

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equivalent.cpp
# Opt level: O2

bool fs_equivalent(string_view path1,string_view path2)

{
  string_view path2_00;
  string_view path1_00;
  _Bool _Var1;
  undefined1 uVar2;
  string_view path;
  string_view path_00;
  string_view fname;
  path local_e0;
  string p2;
  string p1;
  error_code ec;
  string_view path2_local;
  string_view path1_local;
  path local_48;
  
  path2_local._M_str = path2._M_str;
  path2_local._M_len = path2._M_len;
  path1_local._M_str = path1._M_str;
  path1_local._M_len = path1._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&p1,&path1_local,(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&p2,&path2_local,(allocator<char> *)&local_e0);
  _Var1 = fs_is_mingw();
  if (_Var1) {
    path._M_str = p1._M_dataplus._M_p;
    path._M_len = p1._M_string_length;
    fs_canonical_abi_cxx11_(&local_e0._M_pathname,path,true,false);
    std::__cxx11::string::operator=((string *)&p1,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    path_00._M_str = p2._M_dataplus._M_p;
    path_00._M_len = p2._M_string_length;
    fs_canonical_abi_cxx11_(&local_e0._M_pathname,path_00,true,false);
    std::__cxx11::string::operator=((string *)&p2,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_e0,&p1,auto_format);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,&p2,auto_format);
  uVar2 = std::filesystem::equivalent(&local_e0,&local_48,&ec);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_e0);
  if (ec._M_value != 0) {
    path1_00._M_str = path1_local._M_str;
    path1_00._M_len = path1_local._M_len;
    path2_00._M_str = path2_local._M_str;
    path2_00._M_len = path2_local._M_len;
    fname._M_str = "fs_equivalent";
    fname._M_len = 0xd;
    fs_print_error(path1_00,path2_00,fname,&ec);
    uVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&p2);
  std::__cxx11::string::~string((string *)&p1);
  return (bool)uVar2;
}

Assistant:

bool fs_equivalent(std::string_view path1, std::string_view path2)
{
  // non-existent paths are not equivalent

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM

  std::string p1(path1);
  std::string p2(path2);

  if(fs_is_mingw()){
    // MinGW falsely gives mismatch if not canonicalized
    p1 = fs_canonical(p1, true, false);
    p2 = fs_canonical(p2, true, false);
  }

  bool e = std::filesystem::equivalent(p1, p2, ec);
  if(!ec)
    return e;

#else

  int r1 = 0;
  int r2 = 0;

#if defined(STATX_BASIC_STATS) && defined(USE_STATX)

  struct statx x1;
  struct statx x2;

  r1 = statx(AT_FDCWD, path1.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x1);
  if(r1 == 0){
    r2 = statx(AT_FDCWD, path2.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x2);
    if(r2 == 0)
      return x1.stx_dev_major == x2.stx_dev_major && x1.stx_dev_minor == x2.stx_dev_minor && x1.stx_ino == x2.stx_ino;
  }

#endif

  if((r1 == 0 && r2 == 0) || errno == ENOSYS){
    struct stat s1;
    struct stat s2;

    // https://www.boost.org/doc/libs/1_86_0/libs/filesystem/doc/reference.html#equivalent
    if(!stat(path1.data(), &s1) && !stat(path2.data(), &s2))
      return s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino;
  }

#endif

  fs_print_error(path1, path2, __func__, ec);
  return false;
}